

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O3

void __thiscall sptk::reaper::FdFilter::~FdFilter(FdFilter *this)

{
  FFT *this_00;
  
  if (this->input_buffer_ != (int16_t *)0x0) {
    operator_delete__(this->input_buffer_);
  }
  if (this->output_buffer_ != (int16_t *)0x0) {
    operator_delete__(this->output_buffer_);
  }
  if (this->x_ != (float *)0x0) {
    operator_delete__(this->x_);
  }
  if (this->y_ != (float *)0x0) {
    operator_delete__(this->y_);
  }
  if (this->xf_ != (float *)0x0) {
    operator_delete__(this->xf_);
  }
  if (this->yf_ != (float *)0x0) {
    operator_delete__(this->yf_);
  }
  if (this->filter_coeffs_ != (float *)0x0) {
    operator_delete__(this->filter_coeffs_);
  }
  if (this->leftovers_ != (int16_t *)0x0) {
    operator_delete__(this->leftovers_);
  }
  if (this->output_delayed_ != (float *)0x0) {
    operator_delete__(this->output_delayed_);
  }
  this_00 = this->fft_;
  if (this_00 != (FFT *)0x0) {
    FFT::~FFT(this_00);
  }
  operator_delete(this_00);
  return;
}

Assistant:

FdFilter::~FdFilter() {
  delete [] input_buffer_;
  delete [] output_buffer_;
  delete [] x_;
  delete [] y_;
  delete [] xf_;
  delete [] yf_;
  delete [] filter_coeffs_;
  delete [] leftovers_;
  delete [] output_delayed_;
  delete fft_;
}